

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::AddTargetDepend
          (cmComputeTargetDepends *this,int depender_index,cmGeneratorTarget *dependee,
          cmListFileBacktrace *dependee_backtrace,bool linking)

{
  bool bVar1;
  TargetType TVar2;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *psVar3;
  _Base_ptr p_Var4;
  iterator iVar5;
  int dependee_index;
  bool local_39;
  cmGeneratorTarget *local_38;
  int local_2c;
  
  local_38 = dependee;
  bVar1 = cmGeneratorTarget::IsImported(dependee);
  if ((!bVar1) && (TVar2 = cmGeneratorTarget::GetType(dependee), TVar2 != INTERFACE_LIBRARY)) {
    iVar5 = std::
            _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_int>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_int>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
            ::find(&(this->TargetIndex)._M_t,&local_38);
    if ((_Rb_tree_header *)iVar5._M_node != &(this->TargetIndex)._M_t._M_impl.super__Rb_tree_header)
    {
      local_2c = *(int *)&iVar5._M_node[1]._M_parent;
      local_39 = !linking;
      std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
      emplace_back<int&,bool,cmListFileBacktrace_const&>
                ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                 ((this->InitialGraph).
                  super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                  super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                  super__Vector_impl_data._M_start + depender_index),&local_2c,&local_39,
                 dependee_backtrace);
      return;
    }
    __assert_fail("tii != this->TargetIndex.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmComputeTargetDepends.cxx"
                  ,0x178,
                  "void cmComputeTargetDepends::AddTargetDepend(int, const cmGeneratorTarget *, const cmListFileBacktrace &, bool)"
                 );
  }
  psVar3 = cmGeneratorTarget::GetUtilityItems(dependee);
  for (p_Var4 = (psVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(psVar3->_M_t)._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    if (*(cmGeneratorTarget **)(p_Var4 + 2) != (cmGeneratorTarget *)0x0) {
      AddTargetDepend(this,depender_index,*(cmGeneratorTarget **)(p_Var4 + 2),
                      (cmListFileBacktrace *)&p_Var4[2]._M_parent,false);
    }
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddTargetDepend(
  int depender_index, cmGeneratorTarget const* dependee,
  cmListFileBacktrace const& dependee_backtrace, bool linking)
{
  if (dependee->IsImported() ||
      dependee->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    // Skip IMPORTED and INTERFACE targets but follow their utility
    // dependencies.
    std::set<cmLinkItem> const& utils = dependee->GetUtilityItems();
    for (cmLinkItem const& i : utils) {
      if (cmGeneratorTarget const* transitive_dependee = i.Target) {
        this->AddTargetDepend(depender_index, transitive_dependee, i.Backtrace,
                              false);
      }
    }
  } else {
    // Lookup the index for this target.  All targets should be known by
    // this point.
    std::map<cmGeneratorTarget const*, int>::const_iterator tii =
      this->TargetIndex.find(dependee);
    assert(tii != this->TargetIndex.end());
    int dependee_index = tii->second;

    // Add this entry to the dependency graph.
    this->InitialGraph[depender_index].emplace_back(dependee_index, !linking,
                                                    dependee_backtrace);
  }
}